

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
int_writer<int,fmt::v5::basic_format_specs<char>>::num_writer::operator()
          (num_writer *this,char **it)

{
  int iVar1;
  char *__dest;
  byte bVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  undefined1 *puVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  ptrdiff_t _Num;
  size_t __n;
  char_type buffer [13];
  undefined1 auStack_26 [14];
  
  __dest = *it;
  uVar5 = (ulong)*(uint *)this;
  iVar1 = *(int *)(this + 4);
  __n = (size_t)iVar1;
  puVar7 = auStack_26 + __n + 1;
  if (uVar5 < 100) {
    if (*(uint *)this < 10) goto LAB_001357c4;
    uVar6 = uVar5 * 2;
    auStack_26[__n] = internal::basic_data<void>::DIGITS[uVar5 * 2 + 1];
LAB_001357d9:
    puVar7 = puVar7 + -1;
  }
  else {
    iVar8 = 0;
    do {
      uVar6 = uVar5;
      uVar3 = (uint)uVar6;
      uVar5 = uVar6 / 100;
      iVar4 = (int)(uVar6 / 100);
      uVar9 = (ulong)((uVar3 + iVar4 * -100) * 2);
      puVar7[-1] = internal::basic_data<void>::DIGITS[uVar9 + 1];
      if (iVar8 * -0x55555555 + 0xaaaaaaabU < 0x55555556) {
        *(num_writer *)(puVar7 + -2) = this[8];
        puVar7[-3] = internal::basic_data<void>::DIGITS[uVar9];
        if ((uint)((iVar8 + 2) * -0x55555555) < 0x55555556) {
          lVar10 = -4;
          goto LAB_00135775;
        }
        puVar7 = puVar7 + -3;
      }
      else {
        puVar7[-2] = internal::basic_data<void>::DIGITS[uVar9];
        if ((uint)((iVar8 + 2) * -0x55555555) < 0x55555556) {
          lVar10 = -3;
LAB_00135775:
          *(num_writer *)(puVar7 + lVar10) = this[8];
          puVar7 = puVar7 + lVar10;
        }
        else {
          puVar7 = puVar7 + -2;
        }
      }
      iVar8 = iVar8 + 2;
    } while (9999 < uVar3);
    if (uVar3 < 1000) {
LAB_001357c4:
      bVar2 = (byte)uVar5 | 0x30;
      goto LAB_001357e8;
    }
    uVar6 = (ulong)(uint)(iVar4 + (int)(uVar6 / 100));
    puVar7[-1] = internal::basic_data<void>::DIGITS[uVar6 + 1];
    if (0x55555555 < iVar8 * -0x55555555 + 0xaaaaaaabU) goto LAB_001357d9;
    *(num_writer *)(puVar7 + -2) = this[8];
    puVar7 = puVar7 + -2;
  }
  bVar2 = internal::basic_data<void>::DIGITS[uVar6 & 0xffffffff];
LAB_001357e8:
  puVar7[-1] = bVar2;
  if (iVar1 != 0) {
    memcpy(__dest,auStack_26 + 1,__n);
  }
  *it = __dest + __n;
  return;
}

Assistant:

void operator()(It &&it) const {
        basic_string_view<char_type> s(&sep, SEP_SIZE);
        it = internal::format_decimal<char_type>(
              it, abs_value, size, internal::add_thousands_sep<char_type>(s));
      }